

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

FieldGeneratorBase *
google::protobuf::compiler::csharp::CreateFieldGenerator
          (FieldDescriptor *descriptor,int presenceIndex,Options *options)

{
  bool bVar1;
  WrapperFieldGenerator *this;
  OneofDescriptor *pOVar2;
  
  if ((byte)descriptor[2] - 10 < 2) {
    bVar1 = FieldDescriptor::is_repeated(descriptor);
    if (bVar1) {
      bVar1 = FieldDescriptor::is_map(descriptor);
      this = (WrapperFieldGenerator *)operator_new(0x40);
      if (bVar1) {
        MapFieldGenerator::MapFieldGenerator
                  ((MapFieldGenerator *)this,descriptor,presenceIndex,options);
      }
      else {
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)this,descriptor,presenceIndex,options);
      }
    }
    else {
      bVar1 = IsWrapperType(descriptor);
      pOVar2 = FieldDescriptor::real_containing_oneof(descriptor);
      if (bVar1) {
        this = (WrapperFieldGenerator *)operator_new(0x48);
        if (pOVar2 == (OneofDescriptor *)0x0) {
          WrapperFieldGenerator::WrapperFieldGenerator(this,descriptor,presenceIndex,options);
        }
        else {
          WrapperOneofFieldGenerator::WrapperOneofFieldGenerator
                    ((WrapperOneofFieldGenerator *)this,descriptor,presenceIndex,options);
        }
      }
      else {
        this = (WrapperFieldGenerator *)operator_new(0x40);
        if (pOVar2 == (OneofDescriptor *)0x0) {
          MessageFieldGenerator::MessageFieldGenerator
                    ((MessageFieldGenerator *)this,descriptor,presenceIndex,options);
        }
        else {
          MessageOneofFieldGenerator::MessageOneofFieldGenerator
                    ((MessageOneofFieldGenerator *)this,descriptor,presenceIndex,options);
        }
      }
    }
  }
  else if (descriptor[2] == (FieldDescriptor)0xe) {
    bVar1 = FieldDescriptor::is_repeated(descriptor);
    if (bVar1) {
      this = (WrapperFieldGenerator *)operator_new(0x40);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,descriptor,presenceIndex,options);
    }
    else {
      pOVar2 = FieldDescriptor::real_containing_oneof(descriptor);
      this = (WrapperFieldGenerator *)operator_new(0x48);
      if (pOVar2 == (OneofDescriptor *)0x0) {
        EnumFieldGenerator::EnumFieldGenerator
                  ((EnumFieldGenerator *)this,descriptor,presenceIndex,options);
      }
      else {
        EnumOneofFieldGenerator::EnumOneofFieldGenerator
                  ((EnumOneofFieldGenerator *)this,descriptor,presenceIndex,options);
      }
    }
  }
  else {
    bVar1 = FieldDescriptor::is_repeated(descriptor);
    if (bVar1) {
      this = (WrapperFieldGenerator *)operator_new(0x40);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)this,descriptor,presenceIndex,options);
    }
    else {
      pOVar2 = FieldDescriptor::real_containing_oneof(descriptor);
      this = (WrapperFieldGenerator *)operator_new(0x48);
      if (pOVar2 == (OneofDescriptor *)0x0) {
        PrimitiveFieldGenerator::PrimitiveFieldGenerator
                  ((PrimitiveFieldGenerator *)this,descriptor,presenceIndex,options);
      }
      else {
        PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                  ((PrimitiveOneofFieldGenerator *)this,descriptor,presenceIndex,options);
      }
    }
  }
  return &this->super_FieldGeneratorBase;
}

Assistant:

FieldGeneratorBase* CreateFieldGenerator(const FieldDescriptor* descriptor,
                                         int presenceIndex,
                                         const Options* options) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      if (descriptor->is_repeated()) {
        if (descriptor->is_map()) {
          return new MapFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new RepeatedMessageFieldGenerator(descriptor, presenceIndex,
                                                   options);
        }
      } else {
        if (IsWrapperType(descriptor)) {
          if (descriptor->real_containing_oneof()) {
            return new WrapperOneofFieldGenerator(descriptor, presenceIndex,
                                                  options);
          } else {
            return new WrapperFieldGenerator(descriptor, presenceIndex,
                                             options);
          }
        } else {
          if (descriptor->real_containing_oneof()) {
            return new MessageOneofFieldGenerator(descriptor, presenceIndex,
                                                  options);
          } else {
            return new MessageFieldGenerator(descriptor, presenceIndex,
                                             options);
          }
        }
      }
    case FieldDescriptor::TYPE_ENUM:
      if (descriptor->is_repeated()) {
        return new RepeatedEnumFieldGenerator(descriptor, presenceIndex,
                                              options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new EnumOneofFieldGenerator(descriptor, presenceIndex,
                                             options);
        } else {
          return new EnumFieldGenerator(descriptor, presenceIndex, options);
        }
      }
    default:
      if (descriptor->is_repeated()) {
        return new RepeatedPrimitiveFieldGenerator(descriptor, presenceIndex,
                                                   options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new PrimitiveOneofFieldGenerator(descriptor, presenceIndex,
                                                  options);
        } else {
          return new PrimitiveFieldGenerator(descriptor, presenceIndex,
                                             options);
        }
      }
  }
}